

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.cpp
# Opt level: O3

wostream * Centaurus::printc(wostream *os,wchar_t ch)

{
  int iVar1;
  wostream *pwVar2;
  size_t sVar3;
  wchar_t *pwVar4;
  wchar_t buf [16];
  wchar_t local_58 [16];
  
  iVar1 = iswgraph(ch);
  if (iVar1 == 0) {
    swprintf(local_58,0x10,L"\\\\x%0X",(ulong)(uint)ch);
    sVar3 = wcslen(local_58);
LAB_0011d35a:
    pwVar2 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,local_58,sVar3);
    return pwVar2;
  }
  if (ch == L'\\') {
    pwVar4 = L"\\\\";
  }
  else {
    if (ch != L'\"') {
      sVar3 = 1;
      local_58[0] = ch;
      goto LAB_0011d35a;
    }
    pwVar4 = L"\\\"";
  }
  pwVar2 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,pwVar4,2);
  return pwVar2;
}

Assistant:

static std::wostream& printc(std::wostream& os, wchar_t ch)
{
	if (!iswgraph(ch))
	{
		wchar_t buf[16];
		swprintf(buf, 16, L"\\\\x%0X", (wint_t)ch);
		return os << buf;
	}
	else
	{
		switch (ch)
		{
		case L'"':
			return os << L"\\\"";
		case L'\\':
			return os << L"\\\\";
		default:
			return os << ch;
		}
	}
}